

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conv.cc
# Opt level: O1

void __thiscall
cnn::Conv1DWide::backward_impl
          (Conv1DWide *this,vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,
          Tensor *fx,Tensor *dEdf,uint i,Tensor *dEdxi)

{
  float fVar1;
  pointer ppTVar2;
  Tensor *pTVar3;
  Tensor *pTVar4;
  undefined1 auVar5 [16];
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  uint *puVar13;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> di;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> d;
  uint local_a0;
  uint local_9c;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_90;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_70;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> local_50;
  
  if (1 < i) {
    __assert_fail("i < 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/conv.cc"
                  ,0xe9,
                  "virtual void cnn::Conv1DWide::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                 );
  }
  ppTVar2 = (xs->super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  pTVar3 = *ppTVar2;
  pTVar4 = ppTVar2[1];
  local_9c = 1;
  local_a0 = 1;
  if (1 < (pTVar3->d).nd) {
    local_a0 = (pTVar3->d).d[1];
  }
  uVar7 = (ulong)(pTVar3->d).d[0];
  if (1 < (pTVar4->d).nd) {
    local_9c = (pTVar4->d).d[1];
  }
  Tensor::operator*(&local_50,dEdf);
  Tensor::operator*(&local_70,dEdxi);
  if (i == 0) {
    Tensor::operator*(&local_90,
                      (xs->
                      super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>)
                      ._M_impl.super__Vector_impl_data._M_start[1]);
    if (uVar7 != 0) {
      lVar6 = 0;
      uVar8 = 0;
      do {
        if (local_a0 != 0) {
          uVar9 = 0;
          do {
            if (local_9c != 0) {
              if (local_90.
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_rows.m_value <= (long)uVar8) goto LAB_00226eab;
              puVar13 = (uint *)((long)local_90.
                                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                       .
                                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                       .m_data + lVar6);
              lVar11 = 0;
              do {
                if ((((local_90.
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                       .
                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                       .m_cols.m_value <= lVar11) ||
                     (local_50.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_rows.m_value <= (long)uVar8)) ||
                    (uVar12 = (ulong)(uint)((int)uVar9 + (int)lVar11),
                    local_50.
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_cols.m_value <= (long)uVar12)) ||
                   ((local_70.
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_rows.m_value <= (long)uVar8 ||
                    (local_70.
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_cols.m_value <= (long)uVar9)))) goto LAB_00226eab;
                auVar5 = vfmadd213ss_fma(ZEXT416((uint)local_50.
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                  .m_data[uVar8 + uVar12 * local_50.
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                  .m_rows.m_value]),ZEXT416(*puVar13),
                                         ZEXT416((uint)local_70.
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                  .m_data[local_70.
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                  .m_rows.m_value * uVar9 + uVar8]));
                local_70.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_data[local_70.
                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                        .
                        super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                        .m_rows.m_value * uVar9 + uVar8] = auVar5._0_4_;
                lVar11 = lVar11 + 1;
                puVar13 = puVar13 + local_90.
                                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                    .
                                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                    .m_rows.m_value;
              } while (local_9c != (uint)lVar11);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != local_a0);
        }
        uVar8 = uVar8 + 1;
        lVar6 = lVar6 + 4;
      } while (uVar8 != uVar7);
    }
  }
  else {
    Tensor::operator*(&local_90,
                      *(xs->
                       super__Vector_base<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>
                       )._M_impl.super__Vector_impl_data._M_start);
    if (uVar7 != 0) {
      lVar6 = 0;
      uVar8 = 0;
      do {
        if (local_a0 != 0) {
          uVar10 = 0;
          do {
            if ((local_90.
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                 .
                 super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                 .m_rows.m_value <= (long)uVar8) ||
               (local_90.
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                .
                super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                .m_cols.m_value <= (long)(ulong)uVar10)) goto LAB_00226eab;
            if (local_9c != 0) {
              if (local_50.
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                  .
                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                  .m_rows.m_value <= (long)uVar8) {
LAB_00226eab:
                __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                              "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                              "Scalar &Eigen::DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float, -1, -1>>, 1>::operator()(Index, Index) [Derived = Eigen::Map<Eigen::Matrix<float, -1, -1>>, Level = 1]"
                             );
              }
              fVar1 = local_90.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_data[uVar8 + (ulong)uVar10 *
                                      local_90.
                                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                      .
                                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                      .m_rows.m_value];
              puVar13 = (uint *)((long)local_70.
                                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                       .
                                       super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                       .m_data + lVar6);
              lVar11 = 0;
              do {
                uVar9 = (ulong)(uVar10 + (int)lVar11);
                if (((local_50.
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                      .
                      super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                      .m_cols.m_value <= (long)uVar9) ||
                    (local_70.
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                     .
                     super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                     .m_rows.m_value <= (long)uVar8)) ||
                   (local_70.
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                    .
                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                    .m_cols.m_value <= lVar11)) goto LAB_00226eab;
                auVar5 = vfmadd213ss_fma(ZEXT416((uint)local_50.
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                  .m_data[uVar8 + uVar9 * local_50.
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                                  .
                                                  super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                                  .m_rows.m_value]),ZEXT416((uint)fVar1),
                                         ZEXT416(*puVar13));
                *puVar13 = auVar5._0_4_;
                lVar11 = lVar11 + 1;
                puVar13 = puVar13 + local_70.
                                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
                                    .
                                    super_MapBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_0>
                                    .m_rows.m_value;
              } while (local_9c != (uint)lVar11);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 != local_a0);
        }
        uVar8 = uVar8 + 1;
        lVar6 = lVar6 + 4;
      } while (uVar8 != uVar7);
    }
  }
  return;
}

Assistant:

void Conv1DWide::backward_impl(const vector<const Tensor*>& xs,
                          const Tensor& fx,
                          const Tensor& dEdf,
                          unsigned i,
                          Tensor& dEdxi) const {
#ifdef HAVE_CUDA
  throw std::runtime_error("Conv1DWide::backward not implemented for CUDA");
#else
  assert(i < 2);
  const unsigned rows = xs[0]->d.rows();
  const unsigned xcols = xs[0]->d.cols();
  const unsigned fcols = xs[1]->d.cols();
  auto d = *dEdf;
  auto di = *dEdxi;
  if (i == 0) { // derivative wrt input x
    auto f = **xs[1];
    for (unsigned i = 0; i < rows; ++i) {
      for (unsigned j = 0; j < xcols; ++j) {
        for (unsigned k = 0; k < fcols; ++k)
          di(i, j) += f(i, k) * d(i, j + k);
      }
    }
  } else { // derivative wrt filter f
    auto x = **xs[0];
    for (unsigned i = 0; i < rows; ++i) {
      for (unsigned j = 0; j < xcols; ++j) {
        const float xij = x(i, j);
        for (unsigned k = 0; k < fcols; ++k)
          di(i, k) += xij * d(i, j + k);
      }
    }
  }
#endif
}